

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O1

void __thiscall PDFDate::SetToCurrentTime(PDFDate *this)

{
  undefined1 auVar1 [16];
  tm *ptVar2;
  time_t __time1;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  time_t localEpoch;
  time_t currentTime;
  time_t local_20;
  time_t local_18;
  
  time(&local_18);
  ptVar2 = localtime(&local_18);
  uVar4._0_4_ = ptVar2->tm_sec;
  uVar4._4_4_ = ptVar2->tm_min;
  uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
  uVar6._0_4_ = ptVar2->tm_hour;
  uVar6._4_4_ = ptVar2->tm_mday;
  uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
  iVar5 = ptVar2->tm_mon;
  this->Year = ptVar2->tm_year + 0x76c;
  this->Month = iVar5 + 1;
  this->Day = (int)uVar6;
  this->Hour = (int)(uVar6 >> 0x20);
  this->Minute = (int)uVar4;
  this->Second = (int)(uVar4 >> 0x20);
  local_20 = time((time_t *)0x0);
  ptVar2 = gmtime(&local_20);
  ptVar2->tm_isdst = -1;
  __time1 = mktime(ptVar2);
  dVar7 = difftime(__time1,local_20);
  uVar4 = (ulong)dVar7;
  if (uVar4 == 0) {
    iVar5 = 2;
    lVar3 = 0x18;
  }
  else {
    this->UTC = (uint)((long)uVar4 < 1);
    uVar6 = -uVar4;
    if (0 < (long)uVar4) {
      uVar6 = uVar4;
    }
    auVar1 = SEXT816((long)(uVar6 % 0xe10)) * ZEXT816(0x8888888888888889);
    this->HourFromUTC = (int)(uVar6 / 0xe10);
    iVar5 = (int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f);
    lVar3 = 0x20;
  }
  *(int *)((long)&this->Year + lVar3) = iVar5;
  return;
}

Assistant:

void PDFDate::SetToCurrentTime()
{
	time_t currentTime;
	tm structuredLocalTime;
	long timeZoneSecondsDifference;

	time(&currentTime);
	SAFE_LOCAL_TIME(structuredLocalTime,currentTime);

	Year = structuredLocalTime.tm_year + 1900;
	Month = structuredLocalTime.tm_mon + 1;
	Day = structuredLocalTime.tm_mday;
	Hour = structuredLocalTime.tm_hour;
	Minute = structuredLocalTime.tm_min;
	Second = structuredLocalTime.tm_sec;

	// if unsuccesful or method unknown don't provide UTC info (currently only knows for WIN32 and OSX
#if defined (__MWERKS__) || defined (__GNUC__)  || defined(_AIX32) || defined(WIN32)
	int status;
#if !defined(__MWERKS__) // (using c methods)
	struct tm *gmTime;

	time_t localEpoch, gmEpoch;

	/*First get local epoch time*/
	localEpoch = time(NULL);

	/* Using local time epoch get the GM Time */
	gmTime = gmtime(&localEpoch);
	gmTime->tm_isdst = -1;
	/* Convert gm time in to epoch format */
	gmEpoch = mktime(gmTime);

	timeZoneSecondsDifference =difftime(gmEpoch, localEpoch);
	status = 0;
#else // __MWERKS__ (using OSX methods)
	CFTimeZoneRef tzRef = ::CFTimeZoneCopySystem();
	if (tzRef)
	{
		CFTimeInterval intervalFromGMT = ::CFTimeZoneGetSecondsFromGMT(tzRef, currentTime);
		::CFRelease(tzRef);
		timeZoneSecondsDifference = intervalFromGMT;
		status = 0;
	}
	else
		status = -1;
#endif

	if(0 == status)
	{
		if(0 == timeZoneSecondsDifference)
		{
			UTC = eSame;
		}
		else
		{
			UTC = timeZoneSecondsDifference > 0 ? eEarlier : eLater;
			HourFromUTC = (int)(labs(timeZoneSecondsDifference) / 3600);
			MinuteFromUTC = (int)((labs(timeZoneSecondsDifference) - (labs(timeZoneSecondsDifference) / 3600)*3600) / 60);
		}
	}
	else
	{
		UTC = eUndefined;
		TRACE_LOG("PDFDate::SetToCurrentTime, Couldn't get UTC.");
	}

#else
	UTC = eUndefined;
#endif
}